

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

size_t __thiscall fmt::v7::detail::fixed_buffer_traits::limit(fixed_buffer_traits *this,size_t size)

{
  size_t local_38;
  ulong local_30;
  size_t n;
  size_t size_local;
  fixed_buffer_traits *this_local;
  
  if (this->count_ < this->limit_) {
    local_30 = this->limit_ - this->count_;
  }
  else {
    local_30 = 0;
  }
  this->count_ = size + this->count_;
  local_38 = size;
  if (local_30 <= size) {
    local_38 = local_30;
  }
  return local_38;
}

Assistant:

size_t limit(size_t size) {
    size_t n = limit_ > count_ ? limit_ - count_ : 0;
    count_ += size;
    return size < n ? size : n;
  }